

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

void __thiscall flatbuffers::FlatBufMethod::FlatBufMethod(FlatBufMethod *this,RPCCall *method)

{
  RPCCall *pRVar1;
  bool bVar2;
  Value *pVVar3;
  allocator<char> local_41;
  string local_40;
  Value *local_20;
  Value *val;
  RPCCall *method_local;
  FlatBufMethod *this_local;
  
  val = (Value *)method;
  method_local = (RPCCall *)this;
  grpc_generator::Method::Method(&this->super_Method);
  (this->super_Method).super_CommentHolder._vptr_CommentHolder =
       (_func_int **)&PTR__FlatBufMethod_004fb038;
  this->method_ = (RPCCall *)val;
  this->streaming_ = kNone;
  pRVar1 = this->method_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"streaming",&local_41);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(&(pRVar1->super_Definition).attributes,&local_40)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (pVVar3 != (Value *)0x0) {
    local_20 = pVVar3;
    bVar2 = std::operator==(&pVVar3->constant,"client");
    if (bVar2) {
      this->streaming_ = kClient;
    }
    bVar2 = std::operator==(&local_20->constant,"server");
    if (bVar2) {
      this->streaming_ = kServer;
    }
    bVar2 = std::operator==(&local_20->constant,"bidi");
    if (bVar2) {
      this->streaming_ = kBiDi;
    }
  }
  return;
}

Assistant:

FlatBufMethod(const RPCCall *method) : method_(method) {
    streaming_ = kNone;
    auto val = method_->attributes.Lookup("streaming");
    if (val) {
      if (val->constant == "client") streaming_ = kClient;
      if (val->constant == "server") streaming_ = kServer;
      if (val->constant == "bidi") streaming_ = kBiDi;
    }
  }